

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

float64 cluster(int32 ts,uint32 n_stream,uint32 n_in_frame,uint32 *veclen,uint32 blksize,
               vector_t **mean,uint32 n_density,codew_t **out_label)

{
  long lVar1;
  int *piVar2;
  uint uVar3;
  vector_t *ppfVar4;
  long lVar5;
  float32 *pfVar6;
  codew_t *pcVar7;
  uint32 n_obs;
  int iVar8;
  uint uVar9;
  cmd_ln_t *pcVar10;
  char *__s1;
  vector_t *ppfVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  size_t sVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint32 veclen_00;
  ulong uVar21;
  double dVar22;
  codew_t *local_b0;
  float64 local_a8;
  vector_t *local_a0;
  ulong local_98;
  long local_90;
  vector_t *local_88;
  ulong local_80;
  ulong local_78;
  codew_t *local_70;
  vector_t *local_68;
  uint32 local_60;
  uint32 local_5c;
  uint32 local_58;
  uint32 local_54;
  uint32 *local_50;
  vector_t **local_48;
  ulong local_40;
  double local_38;
  
  *out_label = (codew_t *)0x0;
  local_60 = ts;
  local_58 = n_in_frame;
  local_54 = blksize;
  local_48 = mean;
  k_means_set_get_obs(get_obs);
  local_a8 = 0.0;
  local_38 = 0.0;
  uVar19 = 0;
  local_5c = n_stream;
  local_50 = veclen;
  local_40 = (ulong)n_stream;
  do {
    if (uVar19 == local_40) {
      return (float64)local_38;
    }
    pcVar10 = cmd_ln_get();
    __s1 = cmd_ln_str_r(pcVar10,"-method");
    n_obs = setup_obs(local_60,(uint32)uVar19,local_58,local_5c,veclen,local_54);
    uVar17 = (ulong)n_obs;
    iVar8 = strcmp(__s1,"rkm");
    if (iVar8 == 0) {
      pcVar10 = cmd_ln_get();
      local_68 = (vector_t *)cmd_ln_int_r(pcVar10,"-ntrial");
      uVar20 = veclen[uVar19];
      uVar21 = (ulong)uVar20;
      ppfVar4 = local_48[uVar19];
      local_78 = uVar19;
      pcVar10 = cmd_ln_get();
      dVar22 = cmd_ln_float_r(pcVar10,"-minratio");
      local_90 = CONCAT44(local_90._4_4_,(float)dVar22);
      pcVar10 = cmd_ln_get();
      local_98 = cmd_ln_int_r(pcVar10,"-maxiter");
      local_b0 = (codew_t *)0x0;
      ppfVar11 = (vector_t *)
                 __ckd_calloc_2d__((ulong)n_density,uVar21,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                   ,0x23f);
      local_70 = (codew_t *)0x0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0x241,"Initializing means using random k-means\n");
      local_80 = CONCAT44(local_80._4_4_,(float)uVar17);
      local_a0 = (vector_t *)0x7fb9a2028368022e;
      uVar19 = 0;
      while( true ) {
        if ((int)uVar19 == (int)local_68) break;
        local_a8 = (float64)CONCAT44(local_a8._4_4_,(int)uVar19);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x244,"Trial %u: %u means\n",uVar19,(ulong)n_density);
        iVar8 = 100;
        do {
          for (uVar19 = 0; uVar19 != n_density; uVar19 = uVar19 + 1) {
            dVar22 = drand48();
            pfVar6 = obuf;
            uVar9 = (uint)(long)((float)dVar22 * (float)local_80);
            if (n_obs <= uVar9) {
              __assert_fail("(cc >= 0) && (cc < n_obs)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x24c,
                            "float32 random_kmeans(uint32, uint32, uint32, vector_t *, uint32, float32, uint32, codew_t **)"
                           );
            }
            uVar9 = uVar9 * vlen;
            for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
              ppfVar11[uVar19][uVar17] = (float)pfVar6[uVar9 + uVar17];
            }
          }
          if (n_density < 2) {
            local_88 = (vector_t *)
                       k_means(ppfVar11,n_density,n_obs,uVar20,(float32)local_90,(uint32)local_98,
                               &local_b0);
          }
          else {
            local_88 = (vector_t *)
                       k_means_trineq(ppfVar11,n_density,n_obs,uVar20,(float32)local_90,
                                      (uint32)local_98,&local_b0);
          }
          if (0.0 <= (double)local_88) break;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x265,"\t-> Aborting k-means, bad initialization\n");
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        if ((double)local_a0 <= (double)local_88) {
          if (local_b0 != (codew_t *)0x0) {
            ckd_free(local_b0);
            local_b0 = (codew_t *)0x0;
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x26e,"\tbest-so-far sqerr = %e\n",local_88);
          if (local_70 != (codew_t *)0x0) {
            ckd_free(local_70);
          }
          for (uVar19 = 0; uVar19 != n_density; uVar19 = uVar19 + 1) {
            for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
              ppfVar4[uVar19][uVar17] = ppfVar11[uVar19][uVar17];
            }
          }
          local_70 = local_b0;
          local_a0 = local_88;
        }
        uVar19 = (ulong)(local_a8._0_4_ + 1);
      }
      *out_label = local_70;
      ckd_free_2d(ppfVar11);
      if ((float)(double)local_a0 < 0.0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x349,"Too few observations for kmeans\n");
        return -1.0;
      }
      local_a8 = (float64)(double)(float)(double)local_a0;
      veclen = local_50;
      uVar19 = local_78;
    }
    else {
      iVar8 = strcmp(__s1,"fnkm");
      if (iVar8 == 0) {
        local_80 = (ulong)veclen[uVar19];
        ppfVar4 = local_48[uVar19];
        local_78 = uVar19;
        pcVar10 = cmd_ln_get();
        dVar22 = cmd_ln_float_r(pcVar10,"-minratio");
        local_88 = (vector_t *)CONCAT44(local_88._4_4_,(float)dVar22);
        pcVar10 = cmd_ln_get();
        local_90 = cmd_ln_int_r(pcVar10,"-maxiter");
        local_b0 = (codew_t *)
                   __ckd_calloc__(uVar17,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                  ,0x2f1);
        pvVar12 = __ckd_calloc__((ulong)n_density,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                 ,0x2f2);
        local_68 = (vector_t *)
                   __ckd_calloc_2d__(2,local_80,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x2f5);
        local_98 = local_98 & 0xffffffff00000000;
        uVar21 = 1;
        local_a0 = ppfVar4;
        do {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x2f8,"n_mean == %u\n",uVar21 & 0xffffffff);
          pcVar7 = local_b0;
          pvVar13 = __ckd_calloc__(uVar21,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                   ,0x2c2);
          for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined4 *)((long)pvVar12 + uVar19 * 4) = 0;
          }
          for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
            piVar2 = (int *)((long)pvVar12 + (ulong)pcVar7[uVar19] * 4);
            *piVar2 = *piVar2 + 1;
          }
          for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
            pvVar14 = __ckd_calloc__((ulong)*(uint *)((long)pvVar12 + uVar19 * 4),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                     ,0x2cc);
            *(void **)((long)pvVar13 + uVar19 * 8) = pvVar14;
          }
          pvVar14 = __ckd_calloc__(uVar21,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                   ,0x2cf);
          for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
            uVar18 = (ulong)pcVar7[uVar19];
            lVar5 = *(long *)((long)pvVar13 + uVar18 * 8);
            uVar20 = *(uint *)((long)pvVar14 + uVar18 * 4);
            *(uint *)((long)pvVar14 + uVar18 * 4) = uVar20 + 1;
            *(int *)(lVar5 + (ulong)uVar20 * 4) = (int)uVar19;
          }
          uVar19 = 0;
          while (uVar21 != uVar19) {
            lVar5 = uVar19 * 4;
            lVar1 = uVar19 * 4;
            uVar19 = uVar19 + 1;
            if (*(int *)((long)pvVar14 + lVar5) != *(int *)((long)pvVar12 + lVar1)) {
              __assert_fail("free[k] == occ_cnt[k]",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x2d8,"uint32 **cw_obs(codew_t *, uint32, uint32, uint32 *)");
            }
          }
          ckd_free(pvVar14);
          ppfVar4 = local_68;
          uVar20 = (uint)local_98;
          uVar9 = 0;
          for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
            uVar3 = *(uint *)((long)pvVar12 + uVar19 * 4);
            uVar16 = uVar9;
            if (uVar9 < uVar3) {
              uVar16 = uVar3;
            }
            if (uVar9 < uVar3) {
              uVar20 = (uint)uVar19;
            }
            uVar9 = uVar16;
          }
          local_98 = CONCAT44(local_98._4_4_,uVar20);
          uVar18 = (ulong)uVar20;
          find_farthest_neigh(*(uint32 **)((long)pvVar13 + uVar18 * 8),
                              *(uint32 *)((long)pvVar12 + uVar18 * 4),(uint32)local_80,*local_68,
                              local_68[1]);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x309,"d_max == %e\n");
          uVar19 = local_80;
          veclen_00 = (uint32)local_80;
          k_means_subset(ppfVar4,2,*(uint32 **)((long)pvVar13 + uVar18 * 8),
                         *(uint32 *)((long)pvVar12 + uVar18 * 4),veclen_00,local_88._0_4_,
                         (uint32)local_90,(codew_t **)0x0);
          ppfVar11 = local_a0;
          for (sVar15 = 0; uVar19 != sVar15; sVar15 = sVar15 + 1) {
            local_a0[uVar18][sVar15] = (*ppfVar4)[sVar15];
            local_a0[uVar21][sVar15] = ppfVar4[1][sVar15];
          }
          uVar21 = uVar21 + 1;
          ckd_free(local_b0);
          local_a8 = k_means(ppfVar11,(uint32)uVar21,n_obs,veclen_00,local_88._0_4_,(uint32)local_90
                             ,&local_b0);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                  ,0x322,"\tsquerr == %e\n");
          veclen = local_50;
          uVar19 = local_78;
        } while (uVar21 < n_density);
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x357,"I don\'t know how to do method \'%s\'.  Sorry.\n",__s1);
      }
    }
    uVar19 = uVar19 + 1;
    local_38 = local_38 + (double)local_a8;
  } while( true );
}

Assistant:

float64
cluster(int32 ts,
	uint32 n_stream,
	uint32 n_in_frame,
	uint32 *veclen,
	uint32 blksize,
	vector_t **mean,
	uint32 n_density,
	codew_t **out_label)
{
    float64 sum_sqerr, sqerr=0;
    uint32 s, n_frame;
    const char *meth;
    
    *out_label = NULL;

    k_means_set_get_obs(&get_obs);

    for (s = 0, sum_sqerr = 0; s < n_stream; s++, sum_sqerr += sqerr) {
	meth = cmd_ln_str("-method");

	n_frame = setup_obs(ts, s, n_in_frame, n_stream, veclen, blksize);

	if (strcmp(meth, "rkm") == 0) {
	    sqerr = random_kmeans(cmd_ln_int32("-ntrial"),
				  n_frame,
				  veclen[s],
				  mean[s],
				  n_density,
				  cmd_ln_float32("-minratio"),
				  cmd_ln_int32("-maxiter"),
				  out_label);
	    if (sqerr < 0) {
		E_ERROR("Too few observations for kmeans\n");
		
		return -1.0;
	    }
	}
	else if (strcmp(meth, "fnkm") == 0) {
	    sqerr = furthest_neighbor_kmeans(n_frame,
					     veclen[s],
					     mean[s],
					     n_density,
					     cmd_ln_float32("-minratio"),
					     cmd_ln_int32("-maxiter"));
	}
	else {
	    E_ERROR("I don't know how to do method '%s'.  Sorry.\n", meth);
	}
    }

    return sum_sqerr;
}